

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QLine __thiscall QVariant::toLine(QVariant *this)

{
  QLine QVar1;
  
  QVar1 = qvariant_cast<QLine>(this);
  return QVar1;
}

Assistant:

QLine QVariant::toLine() const
{
    return qvariant_cast<QLine>(*this);
}